

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp9d_api.c
# Opt level: O2

MPP_RET hal_vp9d_deinit(void *ctx)

{
  code *pcVar1;
  MPP_RET MVar2;
  
  MVar2 = MPP_NOK;
  if (((ctx != (void *)0x0) && (*ctx != 0)) &&
     (pcVar1 = *(code **)(*ctx + 0x20), pcVar1 != (code *)0x0)) {
    MVar2 = (*pcVar1)(ctx);
  }
  if (*(MppDev *)((long)ctx + 0x10) != (MppDev)0x0) {
    mpp_dev_deinit(*(MppDev *)((long)ctx + 0x10));
    *(undefined8 *)((long)ctx + 0x10) = 0;
  }
  return MVar2;
}

Assistant:

MPP_RET hal_vp9d_deinit(void *ctx)
{
    MPP_RET ret = MPP_NOK;
    HalVp9dCtx *p = (HalVp9dCtx *)ctx;

    if (p && p->api && p->api->deinit)
        ret = p->api->deinit(ctx);

    if (p->dev) {
        mpp_dev_deinit(p->dev);
        p->dev = NULL;
    }

    return ret;
}